

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

string * __thiscall
cmGlobalNinjaGenerator::CMakeCmd_abi_cxx11_
          (string *__return_storage_ptr__,cmGlobalNinjaGenerator *this)

{
  cmLocalGenerator *this_00;
  const_reference pvVar1;
  string *psVar2;
  string_view source;
  
  pvVar1 = std::
           vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ::at(&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators,0);
  this_00 = (pvVar1->_M_t).
            super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t.
            super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
            super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
  psVar2 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  source._M_str = (psVar2->_M_dataplus)._M_p;
  source._M_len = psVar2->_M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (__return_storage_ptr__,&this_00->super_cmOutputConverter,source,SHELL,false);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalNinjaGenerator::CMakeCmd() const
{
  const auto& lgen = this->LocalGenerators.at(0);
  return lgen->ConvertToOutputFormat(cmSystemTools::GetCMakeCommand(),
                                     cmOutputConverter::SHELL);
}